

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O0

JSONNode ** __thiscall internalJSONNode::at_nocase(internalJSONNode *this,json_string *name_t)

{
  JSONNode *pJVar1;
  bool bVar2;
  json_string *pjVar3;
  char *ch_one;
  char *ch_two;
  json_string local_80;
  JSONNode **local_60;
  JSONNode **myrunner_end;
  JSONNode **myrunner;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  json_string *local_20;
  json_string *name_t_local;
  internalJSONNode *this_local;
  
  local_20 = name_t;
  name_t_local = (json_string *)this;
  bVar2 = isContainer(this);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    Fetch(this);
    myrunner_end = jsonChildren::begin(this->Children);
    local_60 = jsonChildren::end(this->Children);
    for (; myrunner_end != local_60; myrunner_end = myrunner_end + 1) {
      pJVar1 = *myrunner_end;
      pjVar3 = jsonSingletonERROR_NULL_IN_CHILDREN::getValue_abi_cxx11_();
      JSONDebug::_JSON_ASSERT(pJVar1 != (JSONNode *)0x0,pjVar3);
      ::JSONNode::name_abi_cxx11_(&local_80,*myrunner_end);
      ch_one = (char *)std::__cxx11::string::c_str();
      ch_two = (char *)std::__cxx11::string::c_str();
      bVar2 = AreEqualNoCase(ch_one,ch_two);
      std::__cxx11::string::~string((string *)&local_80);
      if (bVar2) {
        return myrunner_end;
      }
    }
  }
  else {
    pjVar3 = jsonSingletonERROR_NON_CONTAINER::getValue_abi_cxx11_();
    std::operator+(&local_40,pjVar3,"at_nocase");
    JSONDebug::_JSON_FAIL(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return (JSONNode **)0x0;
}

Assistant:

JSONNode ** internalJSONNode::at_nocase(const json_string & name_t) json_nothrow {
	   JSON_ASSERT_SAFE(isContainer(), json_global(ERROR_NON_CONTAINER) + JSON_TEXT("at_nocase"), return 0;);
	   Fetch();
	   json_foreach(CHILDREN, myrunner){
		  JSON_ASSERT(*myrunner, json_global(ERROR_NULL_IN_CHILDREN));
		  if (json_unlikely(AreEqualNoCase((*myrunner) -> name().c_str(), name_t.c_str()))) return myrunner;
	   }
	   return 0;
    }